

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::ReplaceInterfaceVarInEntryPoint
          (InterfaceVariableScalarReplacement *this,Instruction *interface_var,
          Instruction *entry_point,uint32_t scalar_var_id)

{
  DefUseManager *this_00;
  Instruction *this_01;
  bool bVar1;
  iterator iVar2;
  initializer_list<unsigned_int> init_list;
  uint32_t interface_var_id;
  uint32_t scalar_var_id_local;
  DefUseManager *local_c0;
  InterfaceVariableScalarReplacement *local_b8;
  Instruction *local_b0;
  undefined1 local_a8 [40];
  string message;
  string local_50;
  
  scalar_var_id_local = scalar_var_id;
  local_c0 = IRContext::get_def_use_mgr((this->super_Pass).context_);
  interface_var_id = Instruction::result_id(interface_var);
  iVar2 = std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&(this->interface_vars_removed_from_entry_point_operands_)._M_h,&interface_var_id);
  this_00 = local_c0;
  if (iVar2.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
    message._M_string_length = (size_type)&scalar_var_id_local;
    message.field_2._8_8_ =
         std::
         _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/interface_var_sroa.cpp:571:7)>
         ::_M_invoke;
    message.field_2._M_allocated_capacity =
         (size_type)
         std::
         _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/interface_var_sroa.cpp:571:7)>
         ::_M_manager;
    local_b8 = this;
    local_b0 = interface_var;
    message._M_dataplus._M_p = (pointer)&interface_var_id;
    bVar1 = Instruction::WhileEachInId(entry_point,(function<bool_(unsigned_int_*)> *)&message);
    if (message.field_2._M_allocated_capacity != 0) {
      (*(code *)message.field_2._M_allocated_capacity)(&message,&message,3);
    }
    this_01 = local_b0;
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&message,"interface variable is not an operand of the entry point",
                 (allocator<char> *)local_a8);
      Instruction::PrettyPrint_abi_cxx11_(&local_50,this_01,0x40);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                     "\n  ",&local_50);
      std::__cxx11::string::append((string *)&message);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      Instruction::PrettyPrint_abi_cxx11_(&local_50,entry_point,0x40);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                     "\n  ",&local_50);
      std::__cxx11::string::append((string *)&message);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      local_a8._0_8_ = (_func_int **)0x0;
      local_a8._8_8_ = 0;
      local_a8._16_4_ = (array<signed_char,_4UL>)0x0;
      local_a8._20_4_ = (array<signed_char,_4UL>)0x0;
      std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
      ::operator()(&((local_b8->super_Pass).context_)->consumer_,SPV_MSG_ERROR,"",
                   (spv_position_t *)local_a8,message._M_dataplus._M_p);
      std::__cxx11::string::_M_dispose();
    }
    else {
      analysis::DefUseManager::AnalyzeInstUse(this_00,entry_point);
      std::__detail::
      _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::insert((_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)&this->interface_vars_removed_from_entry_point_operands_,&interface_var_id);
    }
    bVar1 = !bVar1;
  }
  else {
    init_list._M_len = 1;
    init_list._M_array = (iterator)&local_50;
    local_50._M_dataplus._M_p._0_4_ = scalar_var_id;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector
              ((SmallVector<unsigned_int,_2UL> *)local_a8,init_list);
    message._M_dataplus._M_p._0_4_ = 1;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector
              ((SmallVector<unsigned_int,_2UL> *)&message._M_string_length,
               (SmallVector<unsigned_int,_2UL> *)local_a8);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
    emplace_back<spvtools::opt::Operand>(&entry_point->operands_,(Operand *)&message);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector
              ((SmallVector<unsigned_int,_2UL> *)&message._M_string_length);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector((SmallVector<unsigned_int,_2UL> *)local_a8);
    analysis::DefUseManager::AnalyzeInstUse(local_c0,entry_point);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool InterfaceVariableScalarReplacement::ReplaceInterfaceVarInEntryPoint(
    Instruction* interface_var, Instruction* entry_point,
    uint32_t scalar_var_id) {
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  uint32_t interface_var_id = interface_var->result_id();
  if (interface_vars_removed_from_entry_point_operands_.find(
          interface_var_id) !=
      interface_vars_removed_from_entry_point_operands_.end()) {
    entry_point->AddOperand({SPV_OPERAND_TYPE_ID, {scalar_var_id}});
    def_use_mgr->AnalyzeInstUse(entry_point);
    return true;
  }

  bool success = !entry_point->WhileEachInId(
      [&interface_var_id, &scalar_var_id](uint32_t* id) {
        if (*id == interface_var_id) {
          *id = scalar_var_id;
          return false;
        }
        return true;
      });
  if (!success) {
    std::string message(
        "interface variable is not an operand of the entry point");
    message += "\n  " + interface_var->PrettyPrint(
                            SPV_BINARY_TO_TEXT_OPTION_FRIENDLY_NAMES);
    message += "\n  " + entry_point->PrettyPrint(
                            SPV_BINARY_TO_TEXT_OPTION_FRIENDLY_NAMES);
    context()->consumer()(SPV_MSG_ERROR, "", {0, 0, 0}, message.c_str());
    return false;
  }

  def_use_mgr->AnalyzeInstUse(entry_point);
  interface_vars_removed_from_entry_point_operands_.insert(interface_var_id);
  return true;
}